

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

Move * ddSiftingDown(DdManager *table,int x,int xHigh)

{
  int x_00;
  int iVar1;
  Move *pMVar2;
  int iVar3;
  DdNode *pDVar4;
  int isolated;
  int yindex;
  int xindex;
  int limitSize;
  int R;
  int size;
  int y;
  Move *move;
  Move *moves;
  int xHigh_local;
  int x_local;
  DdManager *table_local;
  
  move = (Move *)0x0;
  x_00 = table->invperm[x];
  yindex = table->keys - table->isolated;
  xindex = 0;
  for (R = xHigh; x < R; R = R + -1) {
    iVar1 = table->invperm[R];
    iVar3 = cuddTestInteract(table,x_00,iVar1);
    if (iVar3 != 0) {
      xindex = (table->subtables[R].keys - (uint)(table->vars[iVar1]->ref == 1)) + xindex;
    }
  }
  R = cuddNextHigh(table,x);
  limitSize = yindex;
  moves._4_4_ = x;
  while( true ) {
    if (xHigh < R || yindex <= limitSize - xindex) {
      return move;
    }
    iVar1 = table->invperm[R];
    iVar3 = cuddTestInteract(table,x_00,iVar1);
    if (iVar3 != 0) {
      xindex = xindex - (table->subtables[R].keys - (uint)(table->vars[iVar1]->ref == 1));
    }
    limitSize = cuddSwapInPlace(table,moves._4_4_,R);
    if ((limitSize == 0) || (pDVar4 = cuddDynamicAllocNode(table), pDVar4 == (DdNode *)0x0)) break;
    pDVar4->index = moves._4_4_;
    pDVar4->ref = R;
    *(int *)((long)&pDVar4->next + 4) = limitSize;
    (pDVar4->type).kids.T = (DdNode *)move;
    if ((double)yindex * table->maxGrowth < (double)limitSize) {
      return (Move *)pDVar4;
    }
    if (limitSize < yindex) {
      yindex = limitSize;
    }
    moves._4_4_ = R;
    R = cuddNextHigh(table,R);
    move = (Move *)pDVar4;
  }
  while (move != (Move *)0x0) {
    pMVar2 = move->next;
    move->y = 0;
    *(DdNode **)&move->flags = table->nextFree;
    table->nextFree = (DdNode *)move;
    move = pMVar2;
  }
  return (Move *)0xffffffffffffffff;
}

Assistant:

static Move *
ddSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         R;      /* upper bound on node decrease */
    int         limitSize;
    int         xindex, yindex;
    int         isolated;
#ifdef DD_DEBUG
    int         checkR;
    int         z;
    int         zindex;
#endif

    moves = NULL;
    /* Initialize R */
    xindex = table->invperm[x];
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (y = xHigh; y > x; y--) {
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R += table->subtables[y].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        checkR = 0;
        for (z = xHigh; z > x; z--) {
            zindex = table->invperm[z];
            if (cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        assert(R == checkR);
#endif
        /* Update upper bound on node decrease. */
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R -= table->subtables[y].keys - isolated;
        }
        size = cuddSwapInPlace(table,x,y);
        if (size == 0) goto ddSiftingDownOutOfMem;
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL) goto ddSiftingDownOutOfMem;
        move->x = x;
        move->y = y;
        move->size = size;
        move->next = moves;
        moves = move;
        if ((double) size > (double) limitSize * table->maxGrowth) break;
        if (size < limitSize) limitSize = size;
        x = y;
        y = cuddNextHigh(table,x);
    }
    return(moves);

ddSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}